

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D_adaptive<std::deque<unsigned_char*,std::allocator<unsigned_char*>>>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  long lVar1;
  size_t n_00;
  uint16_t uVar2;
  long *__ptr;
  size_type sVar3;
  value_type *__x;
  size_t j;
  long lVar4;
  uint i_2;
  ulong uVar5;
  deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pdVar6;
  uint i_1;
  uchar **__x_00;
  long lVar7;
  uint16_t cache [16];
  
  if (n < 0x10000) {
    msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              (strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  __x_00 = strings;
  for (uVar5 = 0; uVar5 < (n & 0xfffffffffffffff0); uVar5 = uVar5 + 0x10) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      uVar2 = get_char<unsigned_short>(__x_00[lVar4],depth);
      cache[lVar4] = uVar2;
    }
    __x = __x_00;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets + cache[lVar4],__x);
      __x = __x + 1;
    }
    __x_00 = __x_00 + 0x10;
  }
  for (; uVar5 < n; uVar5 = uVar5 + 1) {
    uVar2 = get_char<unsigned_short>(*__x_00,depth);
    std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(buckets + uVar2,__x_00)
    ;
    __x_00 = __x_00 + 1;
  }
  pdVar6 = buckets;
  for (lVar4 = 0; lVar4 != 0x10000; lVar4 = lVar4 + 1) {
    sVar3 = std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(pdVar6);
    __ptr[lVar4] = sVar3;
    pdVar6 = pdVar6 + 1;
  }
  lVar4 = 0;
  pdVar6 = buckets;
  for (lVar7 = 0; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
    lVar1 = __ptr[lVar7];
    if (lVar1 != 0) {
      copy<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char**>
                (pdVar6,strings + lVar4);
      lVar4 = lVar4 + lVar1;
    }
    pdVar6 = pdVar6 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x500000; lVar4 = lVar4 + 0x50) {
    std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
              ((deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               ((long)&(buckets->
                       super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                       .super__Deque_impl_data._M_map + lVar4));
  }
  lVar4 = *__ptr;
  for (lVar7 = 1; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
    n_00 = __ptr[lVar7];
    if (n_00 != 0) {
      if ((char)lVar7 != '\0') {
        msd_D_adaptive<std::deque<unsigned_char*,std::allocator<unsigned_char*>>>
                  (strings + lVar4,n_00,depth + 2,buckets);
      }
      lVar4 = lVar4 + n_00;
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}